

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O1

void __thiscall Interpreter::~Interpreter(Interpreter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppCVar2;
  pointer pcVar3;
  
  if (this->connect_command != (ConnectCommand *)0x0) {
    (*(this->connect_command->super_Command)._vptr_Command[3])();
    this->connect_command = (ConnectCommand *)0x0;
  }
  if (this->open_data_server_command != (OpenDataServerCommand *)0x0) {
    (*(this->open_data_server_command->super_Command)._vptr_Command[3])();
    this->open_data_server_command = (OpenDataServerCommand *)0x0;
  }
  if (this->if_command != (IfCommand *)0x0) {
    (*(this->if_command->super_ConditionParser).super_Command._vptr_Command[3])();
    this->if_command = (IfCommand *)0x0;
  }
  if (this->print_command != (PrintCommand *)0x0) {
    (*(this->print_command->super_Command)._vptr_Command[3])();
    this->print_command = (PrintCommand *)0x0;
  }
  if (this->while_command != (WhileCommand *)0x0) {
    (*(this->while_command->super_ConditionParser).super_Command._vptr_Command[3])();
    this->while_command = (WhileCommand *)0x0;
  }
  if (this->sleep_command != (SleepCommand *)0x0) {
    (*(this->sleep_command->super_Command)._vptr_Command[3])();
    this->sleep_command = (SleepCommand *)0x0;
  }
  if (this->assign_var_command != (AssignVarCommand *)0x0) {
    (*(this->assign_var_command->super_Command)._vptr_Command[3])();
    this->assign_var_command = (AssignVarCommand *)0x0;
  }
  if (this->define_var_command != (DefineVarCommand *)0x0) {
    (*(this->define_var_command->super_Command)._vptr_Command[3])();
    this->define_var_command = (DefineVarCommand *)0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
  ::~_Rb_tree(&(this->CMD_DICTIONARY)._M_t);
  ppCVar2 = (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->if_commands_pointers).
                                  super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppCVar2);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->if_strings_vectors);
  ppCVar2 = (this->while_commands_pointers).
            super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->while_commands_pointers).
                                  super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppCVar2);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->while_strings_vectors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->condition_vector_string);
  pcVar3 = (this->condition_string)._M_dataplus._M_p;
  paVar1 = &(this->condition_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->lexed_data_to_interpret);
  return;
}

Assistant:

Interpreter::~Interpreter() {
  if (this->connect_command != nullptr) {
    delete (this->connect_command);
    this->connect_command = nullptr;
  }
  if (this->open_data_server_command != nullptr) {
    delete (this->open_data_server_command);
    this->open_data_server_command = nullptr;
  }
  if (this->if_command != nullptr) {
    delete (this->if_command);
    this->if_command = nullptr;
  }
  if (this->print_command != nullptr) {
    delete (this->print_command);
    this->print_command = nullptr;
  }
  if (this->while_command != nullptr) {
    delete (this->while_command);
    this->while_command = nullptr;
  }
  if (this->sleep_command != nullptr) {
    delete (this->sleep_command);
    this->sleep_command = nullptr;
  }
  if (this->assign_var_command != nullptr) {
    delete (this->assign_var_command);
    this->assign_var_command = nullptr;
  }
  if (this->define_var_command != nullptr) {
    delete (this->define_var_command);
    this->define_var_command = nullptr;
  }
}